

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O2

Aig_Man_t * Ssw_LatchCorrespondence(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  Aig_Man_t *pAVar1;
  Ssw_Pars_t Pars;
  Ssw_Pars_t SStack_b8;
  
  if (pPars == (Ssw_Pars_t *)0x0) {
    Ssw_ManSetDefaultParamsLcorr(&SStack_b8);
    pPars = &SStack_b8;
  }
  pAVar1 = Ssw_SignalCorrespondence(pAig,pPars);
  return pAVar1;
}

Assistant:

Aig_Man_t * Ssw_LatchCorrespondence( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pRes;
    Ssw_Pars_t Pars;
    if ( pPars == NULL )
        Ssw_ManSetDefaultParamsLcorr( pPars = &Pars );
    pRes = Ssw_SignalCorrespondence( pAig, pPars );
//    if ( pPars->fConstrs && pPars->fVerbose )
//        Ssw_ReportConeReductions( pAig, pRes );
    return pRes;
}